

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV newP11Object(CK_OBJECT_CLASS objClass,CK_KEY_TYPE keyType,CK_CERTIFICATE_TYPE certType,
                  P11Object **p11object)

{
  long *plVar1;
  P11DSADomainObj *this;
  void *pvVar2;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  P11DESSecretKeyObj *key_1;
  P11GenericSecretKeyObj *key;
  P11GenericSecretKeyObj *in_stack_ffffffffffffff10;
  
  switch(in_RDI) {
  case 0:
    pvVar2 = operator_new(0x48);
    P11DataObj::P11DataObj((P11DataObj *)in_stack_ffffffffffffff10);
    *in_RCX = pvVar2;
    break;
  case 1:
    if (in_RDX == 0) {
      pvVar2 = operator_new(0x48);
      P11X509CertificateObj::P11X509CertificateObj
                ((P11X509CertificateObj *)in_stack_ffffffffffffff10);
      *in_RCX = pvVar2;
    }
    else {
      if (in_RDX != 0x80504750) {
        return 0x13;
      }
      pvVar2 = operator_new(0x48);
      P11OpenPGPPublicKeyObj::P11OpenPGPPublicKeyObj
                ((P11OpenPGPPublicKeyObj *)in_stack_ffffffffffffff10);
      *in_RCX = pvVar2;
    }
    break;
  case 2:
    if (in_RSI == 0) {
      pvVar2 = operator_new(0x48);
      P11RSAPublicKeyObj::P11RSAPublicKeyObj((P11RSAPublicKeyObj *)in_stack_ffffffffffffff10);
      *in_RCX = pvVar2;
    }
    else if (in_RSI == 1) {
      pvVar2 = operator_new(0x48);
      P11DSAPublicKeyObj::P11DSAPublicKeyObj((P11DSAPublicKeyObj *)in_stack_ffffffffffffff10);
      *in_RCX = pvVar2;
    }
    else if (in_RSI == 3) {
      pvVar2 = operator_new(0x48);
      P11ECPublicKeyObj::P11ECPublicKeyObj((P11ECPublicKeyObj *)in_stack_ffffffffffffff10);
      *in_RCX = pvVar2;
    }
    else if (in_RSI == 2) {
      pvVar2 = operator_new(0x48);
      P11DHPublicKeyObj::P11DHPublicKeyObj((P11DHPublicKeyObj *)in_stack_ffffffffffffff10);
      *in_RCX = pvVar2;
    }
    else if (in_RSI == 0x30) {
      pvVar2 = operator_new(0x48);
      P11GOSTPublicKeyObj::P11GOSTPublicKeyObj((P11GOSTPublicKeyObj *)in_stack_ffffffffffffff10);
      *in_RCX = pvVar2;
    }
    else {
      if (in_RSI != 0x40) {
        return 0x13;
      }
      pvVar2 = operator_new(0x48);
      P11EDPublicKeyObj::P11EDPublicKeyObj((P11EDPublicKeyObj *)in_stack_ffffffffffffff10);
      *in_RCX = pvVar2;
    }
    break;
  case 3:
    if (in_RSI == 0) {
      pvVar2 = operator_new(0x48);
      P11RSAPrivateKeyObj::P11RSAPrivateKeyObj((P11RSAPrivateKeyObj *)in_stack_ffffffffffffff10);
      *in_RCX = pvVar2;
    }
    else if (in_RSI == 1) {
      pvVar2 = operator_new(0x48);
      P11DSAPrivateKeyObj::P11DSAPrivateKeyObj((P11DSAPrivateKeyObj *)in_stack_ffffffffffffff10);
      *in_RCX = pvVar2;
    }
    else if (in_RSI == 3) {
      pvVar2 = operator_new(0x48);
      P11ECPrivateKeyObj::P11ECPrivateKeyObj((P11ECPrivateKeyObj *)in_stack_ffffffffffffff10);
      *in_RCX = pvVar2;
    }
    else if (in_RSI == 2) {
      pvVar2 = operator_new(0x48);
      P11DHPrivateKeyObj::P11DHPrivateKeyObj((P11DHPrivateKeyObj *)in_stack_ffffffffffffff10);
      *in_RCX = pvVar2;
    }
    else if (in_RSI == 0x30) {
      pvVar2 = operator_new(0x48);
      P11GOSTPrivateKeyObj::P11GOSTPrivateKeyObj((P11GOSTPrivateKeyObj *)in_stack_ffffffffffffff10);
      *in_RCX = pvVar2;
    }
    else {
      if (in_RSI != 0x40) {
        return 0x13;
      }
      pvVar2 = operator_new(0x48);
      P11EDPrivateKeyObj::P11EDPrivateKeyObj((P11EDPrivateKeyObj *)in_stack_ffffffffffffff10);
      *in_RCX = pvVar2;
    }
    break;
  case 4:
    if (((((in_RSI == 0x10) || (in_RSI == 0x27)) || (in_RSI == 0x28)) ||
        ((in_RSI == 0x2e || (in_RSI == 0x2b)))) || ((in_RSI == 0x2c || (in_RSI == 0x2d)))) {
      plVar1 = (long *)operator_new(0x50);
      P11GenericSecretKeyObj::P11GenericSecretKeyObj(in_stack_ffffffffffffff10);
      *in_RCX = plVar1;
      (**(code **)(*plVar1 + 0x18))(plVar1,in_RSI);
    }
    else if (in_RSI == 0x1f) {
      pvVar2 = operator_new(0x48);
      P11AESSecretKeyObj::P11AESSecretKeyObj((P11AESSecretKeyObj *)in_stack_ffffffffffffff10);
      *in_RCX = pvVar2;
    }
    else if (((in_RSI == 0x13) || (in_RSI == 0x14)) || (in_RSI == 0x15)) {
      plVar1 = (long *)operator_new(0x50);
      P11DESSecretKeyObj::P11DESSecretKeyObj((P11DESSecretKeyObj *)in_stack_ffffffffffffff10);
      *in_RCX = plVar1;
      (**(code **)(*plVar1 + 0x18))(plVar1,in_RSI);
    }
    else {
      if (in_RSI != 0x32) {
        return 0x13;
      }
      pvVar2 = operator_new(0x48);
      P11GOSTSecretKeyObj::P11GOSTSecretKeyObj((P11GOSTSecretKeyObj *)in_stack_ffffffffffffff10);
      *in_RCX = pvVar2;
    }
    break;
  default:
    return 0x13;
  case 6:
    if (in_RSI == 1) {
      this = (P11DSADomainObj *)operator_new(0x48);
      P11DSADomainObj::P11DSADomainObj(this);
      *in_RCX = this;
    }
    else {
      if (in_RSI != 2) {
        return 0x13;
      }
      pvVar2 = operator_new(0x48);
      P11DHDomainObj::P11DHDomainObj((P11DHDomainObj *)in_stack_ffffffffffffff10);
      *in_RCX = pvVar2;
    }
  }
  return 0;
}

Assistant:

static CK_RV newP11Object(CK_OBJECT_CLASS objClass, CK_KEY_TYPE keyType, CK_CERTIFICATE_TYPE certType, P11Object **p11object)
{
	switch(objClass) {
		case CKO_DATA:
			*p11object = new P11DataObj();
			break;
		case CKO_CERTIFICATE:
			if (certType == CKC_X_509)
				*p11object = new P11X509CertificateObj();
			else if (certType == CKC_OPENPGP)
				*p11object = new P11OpenPGPPublicKeyObj();
			else
				return CKR_ATTRIBUTE_VALUE_INVALID;
			break;
		case CKO_PUBLIC_KEY:
			if (keyType == CKK_RSA)
				*p11object = new P11RSAPublicKeyObj();
			else if (keyType == CKK_DSA)
				*p11object = new P11DSAPublicKeyObj();
			else if (keyType == CKK_EC)
				*p11object = new P11ECPublicKeyObj();
			else if (keyType == CKK_DH)
				*p11object = new P11DHPublicKeyObj();
			else if (keyType == CKK_GOSTR3410)
				*p11object = new P11GOSTPublicKeyObj();
			else if (keyType == CKK_EC_EDWARDS)
				*p11object = new P11EDPublicKeyObj();
			else
				return CKR_ATTRIBUTE_VALUE_INVALID;
			break;
		case CKO_PRIVATE_KEY:
			// we need to know the type too
			if (keyType == CKK_RSA)
				*p11object = new P11RSAPrivateKeyObj();
			else if (keyType == CKK_DSA)
				*p11object = new P11DSAPrivateKeyObj();
			else if (keyType == CKK_EC)
				*p11object = new P11ECPrivateKeyObj();
			else if (keyType == CKK_DH)
				*p11object = new P11DHPrivateKeyObj();
			else if (keyType == CKK_GOSTR3410)
				*p11object = new P11GOSTPrivateKeyObj();
			else if (keyType == CKK_EC_EDWARDS)
				*p11object = new P11EDPrivateKeyObj();
			else
				return CKR_ATTRIBUTE_VALUE_INVALID;
			break;
		case CKO_SECRET_KEY:
			if ((keyType == CKK_GENERIC_SECRET) ||
			    (keyType == CKK_MD5_HMAC) ||
			    (keyType == CKK_SHA_1_HMAC) ||
			    (keyType == CKK_SHA224_HMAC) ||
			    (keyType == CKK_SHA256_HMAC) ||
			    (keyType == CKK_SHA384_HMAC) ||
			    (keyType == CKK_SHA512_HMAC))
			{
				P11GenericSecretKeyObj* key = new P11GenericSecretKeyObj();
				*p11object = key;
				key->setKeyType(keyType);
			}
			else if (keyType == CKK_AES)
			{
				*p11object = new P11AESSecretKeyObj();
			}
			else if ((keyType == CKK_DES) ||
				 (keyType == CKK_DES2) ||
				 (keyType == CKK_DES3))
			{
				P11DESSecretKeyObj* key = new P11DESSecretKeyObj();
				*p11object = key;
				key->setKeyType(keyType);
			}
			else if (keyType == CKK_GOST28147)
			{
				*p11object = new P11GOSTSecretKeyObj();
			}
			else
				return CKR_ATTRIBUTE_VALUE_INVALID;
			break;
		case CKO_DOMAIN_PARAMETERS:
			if (keyType == CKK_DSA)
				*p11object = new P11DSADomainObj();
			else if (keyType == CKK_DH)
				*p11object = new P11DHDomainObj();
			else
				return CKR_ATTRIBUTE_VALUE_INVALID;
			break;
		default:
			return CKR_ATTRIBUTE_VALUE_INVALID; // invalid value for a valid argument
	}
	return CKR_OK;
}